

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

bool __thiscall Liby::http::RequestParser::ParseMethod(RequestParser *this,char *begin,char *end)

{
  pointer ppVar1;
  bool bVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_68;
  iterator it;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string method;
  char *end_local;
  char *begin_local;
  RequestParser *this_local;
  
  bVar2 = false;
  if ((begin <= end) && (bVar2 = false, begin != (char *)0x0)) {
    bVar2 = end != (char *)0x0;
  }
  method.field_2._8_8_ = end;
  if (!bVar2) {
    __assert_fail("begin <= end && begin && end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                  ,0xf6,"bool Liby::http::RequestParser::ParseMethod(const char *, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)local_48,begin,end,&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&methods_abi_cxx11_,(key_type *)local_48);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&methods_abi_cxx11_);
  bVar2 = std::__detail::operator==(&local_68,&local_70);
  if (bVar2) {
    this->progress_ = 6;
  }
  else {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)&local_68);
    (this->super_Request).method_ = ppVar1->second;
    this->progress_ = 2;
  }
  this_local._7_1_ = !bVar2;
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool RequestParser::ParseMethod(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    std::string method((begin), (end));
    auto it = methods.find(method);
    if (it == methods.end()) {
        progress_ = InvalidMethod;
        return false;
    } else {
        method_ = it->second;
        progress_ = ParsingURI;
        return true;
    }
}